

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecryptPDF.cpp
# Opt level: O2

int RecryptPDF(int argc,char **argv)

{
  EStatusCode EVar1;
  LogConfiguration *pLVar2;
  EncryptionOptions *pEVar3;
  char *pcVar4;
  allocator<char> local_2fd;
  allocator<char> local_2fc;
  allocator<char> local_2fb;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  PDFCreationSettings local_218;
  EncryptionOptions local_1b8;
  EncryptionOptions local_168;
  EncryptionOptions local_118;
  EncryptionOptions local_c8;
  EncryptionOptions local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"china.pdf",(allocator<char> *)&local_238);
  BuildRelativeInputPath(&local_278,argv,&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"",(allocator<char> *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"chinaWithoutEncryption.pdf",&local_2fd);
  BuildRelativeOutputPath(&local_2d8,argv,&local_2f8);
  pLVar2 = LogConfiguration::DefaultLogConfiguration();
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_78,pEVar3);
  EncryptionOptions::EncryptionOptions(&local_218.DocumentEncryptionOptions,&local_78);
  local_218.CompressStreams = true;
  local_218.EmbedFonts = true;
  local_218.WriteXrefAsXrefStream = false;
  EVar1 = PDFWriter::RecryptPDF
                    (&local_278,&local_2b8,&local_2d8,pLVar2,&local_218,ePDFVersionUndefined);
  EncryptionOptions::~EncryptionOptions(&local_218.DocumentEncryptionOptions);
  EncryptionOptions::~EncryptionOptions(&local_78);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  pcVar4 = "failed to decrypt PDF\n";
  if (EVar1 == eSuccess) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"PDFWithPassword.pdf",(allocator<char> *)&local_238);
    BuildRelativeInputPath(&local_278,argv,&local_298);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"user",(allocator<char> *)&local_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"RecryptPDFWithPasswordToNothing.pdf",&local_2fd);
    BuildRelativeOutputPath(&local_2d8,argv,&local_2f8);
    pLVar2 = LogConfiguration::DefaultLogConfiguration();
    pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
    EncryptionOptions::EncryptionOptions(&local_c8,pEVar3);
    EncryptionOptions::EncryptionOptions(&local_218.DocumentEncryptionOptions,&local_c8);
    local_218.CompressStreams = true;
    local_218.EmbedFonts = true;
    local_218.WriteXrefAsXrefStream = false;
    EVar1 = PDFWriter::RecryptPDF
                      (&local_278,&local_2b8,&local_2d8,pLVar2,&local_218,ePDFVersionUndefined);
    EncryptionOptions::~EncryptionOptions(&local_218.DocumentEncryptionOptions);
    EncryptionOptions::~EncryptionOptions(&local_c8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    if (EVar1 == eSuccess) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"PDFWithPassword.pdf",&local_2fd);
      BuildRelativeInputPath(&local_278,argv,&local_298);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"user",&local_2f9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"RecryptPDFWithPasswordToNewPassword.pdf",&local_2fa);
      BuildRelativeOutputPath(&local_2d8,argv,&local_2f8);
      pLVar2 = LogConfiguration::DefaultLogConfiguration();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"user1",&local_2fb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"owner1",&local_2fc);
      EncryptionOptions::EncryptionOptions(&local_118,&local_238,4,&local_258);
      EncryptionOptions::EncryptionOptions(&local_218.DocumentEncryptionOptions,&local_118);
      local_218.CompressStreams = true;
      local_218.EmbedFonts = true;
      local_218.WriteXrefAsXrefStream = false;
      EVar1 = PDFWriter::RecryptPDF
                        (&local_278,&local_2b8,&local_2d8,pLVar2,&local_218,ePDFVersionUndefined);
      EncryptionOptions::~EncryptionOptions(&local_218.DocumentEncryptionOptions);
      EncryptionOptions::~EncryptionOptions(&local_118);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      pcVar4 = "failed to encrypt PDF with new password PDF\n";
      if (EVar1 == eSuccess) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"Original.pdf",&local_2fd);
        BuildRelativeInputPath(&local_278,argv,&local_298);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2f9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"RecryptPDFOriginalToPasswordProtected.pdf",&local_2fa);
        BuildRelativeOutputPath(&local_2d8,argv,&local_2f8);
        pLVar2 = LogConfiguration::DefaultLogConfiguration();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"user1",&local_2fb);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"owner1",&local_2fc)
        ;
        EncryptionOptions::EncryptionOptions(&local_168,&local_238,4,&local_258);
        EncryptionOptions::EncryptionOptions(&local_218.DocumentEncryptionOptions,&local_168);
        local_218.CompressStreams = true;
        local_218.EmbedFonts = true;
        local_218.WriteXrefAsXrefStream = false;
        EVar1 = PDFWriter::RecryptPDF
                          (&local_278,&local_2b8,&local_2d8,pLVar2,&local_218,ePDFVersionUndefined);
        EncryptionOptions::~EncryptionOptions(&local_218.DocumentEncryptionOptions);
        EncryptionOptions::~EncryptionOptions(&local_168);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        if (EVar1 == eSuccess) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_298,"Original.pdf",&local_2fd);
          BuildRelativeInputPath(&local_278,argv,&local_298);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"",&local_2f9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,"RecryptPDFOriginalToPasswordProtectedAES.pdf",&local_2fa)
          ;
          BuildRelativeOutputPath(&local_2d8,argv,&local_2f8);
          pLVar2 = LogConfiguration::DefaultLogConfiguration();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,"user1",&local_2fb);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"owner1",&local_2fc);
          EncryptionOptions::EncryptionOptions(&local_1b8,&local_238,4,&local_258);
          EncryptionOptions::EncryptionOptions(&local_218.DocumentEncryptionOptions,&local_1b8);
          local_218.CompressStreams = true;
          local_218.EmbedFonts = true;
          local_218.WriteXrefAsXrefStream = false;
          EVar1 = PDFWriter::RecryptPDF
                            (&local_278,&local_2b8,&local_2d8,pLVar2,&local_218,ePDFVersion16);
          EncryptionOptions::~EncryptionOptions(&local_218.DocumentEncryptionOptions);
          EncryptionOptions::~EncryptionOptions(&local_1b8);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&local_298);
          if (EVar1 == eSuccess) {
            return 0;
          }
        }
      }
    }
  }
  std::operator<<((ostream *)&std::cout,pcVar4);
  return 1;
}

Assistant:

int RecryptPDF(int argc, char* argv[])
{
	EStatusCode status; 

	do
	{
		// recrypt a document with AES encryption, and remove it
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"china.pdf"),
			"",
			BuildRelativeOutputPath(argv,"chinaWithoutEncryption.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to decrypt PDF\n";
			break;
		}

		// recrypt an encrypted document with no password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			"user",
			BuildRelativeOutputPath(argv,"RecryptPDFWithPasswordToNothing.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true,true));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to decrypt PDF\n";
			break;
		}

		// recrypt an encrypted document with new password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			"user",
			BuildRelativeOutputPath(argv,"RecryptPDFWithPasswordToNewPassword.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true,true,EncryptionOptions("user1",4,"owner1")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

		// recrypt a plain to document to one with password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"Original.pdf"),
			"",
			BuildRelativeOutputPath(argv,"RecryptPDFOriginalToPasswordProtected.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true, EncryptionOptions("user1", 4, "owner1")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

		// same, but forcing AES
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"Original.pdf"),
			"",
			BuildRelativeOutputPath(argv,"RecryptPDFOriginalToPasswordProtectedAES.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true, EncryptionOptions("user1", 4, "owner1")),
			ePDFVersion16);
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

	}while(false);

	return status == eSuccess ? 0:1;	
}